

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O2

string * stringformat<int,int>(string *__return_storage_ptr__,char *fmt,int *args,int *args_1)

{
  stringstream buf;
  StringFormatter<int,_int> local_1b8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_1b8.args.super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = (_Head_base<1UL,_int,_false>)*args_1;
  local_1b8.args.super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
       *args;
  local_1b8.fmt = fmt;
  StringFormatter<int,_int>::tostream(&local_1b8,local_198);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string stringformat(const char *fmt, ARGS&&...args)
{
    std::stringstream buf;
    buf << StringFormatter<ARGS...>(fmt, std::forward<ARGS>(args)...);

    return buf.str();
}